

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int luaL_fileresult(lua_State *L,int stat,char *fname)

{
  int __errnum;
  TValue *pTVar1;
  uint64_t uVar2;
  int *piVar3;
  char *pcVar4;
  int en;
  char *fname_local;
  int stat_local;
  lua_State *L_local;
  
  if (stat == 0) {
    piVar3 = __errno_location();
    __errnum = *piVar3;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->u64 = 0xffffffffffffffff;
    if (fname == (char *)0x0) {
      pcVar4 = strerror(__errnum);
      lua_pushfstring(L,"%s",pcVar4);
    }
    else {
      pcVar4 = strerror(__errnum);
      lua_pushfstring(L,"%s: %s",fname,pcVar4);
    }
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = (double)__errnum;
    uVar2 = (L->glref).ptr64;
    *(uint *)(uVar2 + 0x3cc) = *(uint *)(uVar2 + 0x3cc) & 0xffffffef;
    L_local._0_4_ = 3;
  }
  else {
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->u64 = 0xfffeffffffffffff;
    L_local._0_4_ = 1;
  }
  return (int)L_local;
}

Assistant:

LUALIB_API int luaL_fileresult(lua_State *L, int stat, const char *fname)
{
  if (stat) {
    setboolV(L->top++, 1);
    return 1;
  } else {
    int en = errno;  /* Lua API calls may change this value. */
    setnilV(L->top++);
    if (fname)
      lua_pushfstring(L, "%s: %s", fname, strerror(en));
    else
      lua_pushfstring(L, "%s", strerror(en));
    setintV(L->top++, en);
    lj_trace_abort(G(L));
    return 3;
  }
}